

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O1

Element __thiscall wasm::RandomFullLattice::getBottom(RandomFullLattice *this)

{
  long lVar1;
  undefined8 *puVar2;
  _Head_base<0UL,_void_*,_false> extraout_RDX;
  long in_RSI;
  Element EVar3;
  
  lVar1 = (long)*(char *)(*(long *)(in_RSI + 8) + 0x20);
  if (lVar1 != -1) {
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<wasm::RandomElement<wasm::RandomFullLattice>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp:878:5)_&&,_const_std::variant<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>,_wasm::analysis::ValType,_wasm::analysis::Inverted<wasm::RandomFullLattice>,_wasm::analysis::Array<wasm::RandomFullLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomFullLattice>,_wasm::analysis::Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice>_>_&>
      ::_S_vtable._M_arr[lVar1]._M_data)
              ((anon_class_1_0_00000001 *)this,
               (variant<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>,_wasm::analysis::ValType,_wasm::analysis::Inverted<wasm::RandomFullLattice>,_wasm::analysis::Array<wasm::RandomFullLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomFullLattice>,_wasm::analysis::Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice>_>
                *)&stack0xffffffffffffffef);
    EVar3.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
    super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
    _M_head_impl = extraout_RDX._M_head_impl;
    EVar3.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
    super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
    super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
         (_Head_base<1UL,_void_(*)(void_*),_false>)(_Head_base<1UL,_void_(*)(void_*),_false>)this;
    return (Element)EVar3.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                    super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = &PTR__exception_001ed3e8;
  puVar2[1] = "std::visit: variant is valueless";
  __cxa_throw(puVar2,&std::bad_variant_access::typeinfo,std::exception::~exception);
}

Assistant:

RandomFullLattice::Element RandomFullLattice::getBottom() const noexcept {
  return std::visit(
    [](const auto& l) -> Element { return ElementImpl{l.getBottom()}; },
    (const FullLatticeVariant&)*lattice);
}